

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

void __thiscall
rsg::ValueRange::ValueRange(ValueRange *this,VariableType *type,Scalar *minVal,Scalar *maxVal)

{
  pointer pSVar1;
  int iVar2;
  StridedValueRead<1> local_50;
  StridedValueAccess<1> local_40;
  
  VariableType::VariableType(&this->m_type,type);
  iVar2 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_min,(long)iVar2,(allocator_type *)&local_50);
  iVar2 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
            (&this->m_max,(long)iVar2,(allocator_type *)&local_50);
  pSVar1 = (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  if (pSVar1 != (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_40.super_ConstStridedValueAccess<1>.m_value = pSVar1;
  }
  local_50.m_type = type;
  local_50.m_value = minVal;
  local_40.super_ConstStridedValueAccess<1>.m_type = &this->m_type;
  StridedValueAccess<1>::operator=(&local_40,&local_50);
  pSVar1 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  if (pSVar1 != (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_40.super_ConstStridedValueAccess<1>.m_value = pSVar1;
  }
  local_50.m_type = type;
  local_50.m_value = maxVal;
  local_40.super_ConstStridedValueAccess<1>.m_type = &this->m_type;
  StridedValueAccess<1>::operator=(&local_40,&local_50);
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type, const Scalar* minVal, const Scalar* maxVal)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
	getMin() = ConstValueAccess(type, minVal).value();
	getMax() = ConstValueAccess(type, maxVal).value();
}